

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O1

void __thiscall
vkt::FragmentOperations::anon_unknown_0::ScissorRenderer::draw
          (ScissorRenderer *this,Context *context,Vec4 *scissorAreaFloat,VkBuffer colorBuffer)

{
  deUint64 dVar1;
  undefined8 uVar2;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_370;
  VkDeviceSize vertexBufferOffset;
  void *pvStack_350;
  undefined8 local_348;
  VkClearValue *pVStack_340;
  VkPipelineVertexInputStateCreateInfo *local_338;
  undefined8 local_330;
  VkImageAspectFlags local_328;
  deUint32 dStack_324;
  VkPipelineViewportStateCreateInfo *pVStack_320;
  VkPipelineRasterizationStateCreateInfo *local_318;
  VkPipelineMultisampleStateCreateInfo *local_310;
  VkPipelineDepthStencilStateCreateInfo *local_308;
  VkPipelineColorBlendStateCreateInfo *local_300;
  VkPipelineDynamicStateCreateInfo *local_2f8;
  VkPipelineLayout local_2f0;
  VkRenderPass local_2e8;
  deUint32 local_2e0;
  VkPipeline local_2d8;
  deInt32 local_2d0;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkViewport viewport;
  Move<vk::Handle<(vk::HandleType)18>_> local_288;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkClearValue clearValue;
  undefined8 local_1f8;
  deUint64 local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  deUint64 local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  undefined1 local_118 [56];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  undefined8 uStack_bc;
  undefined4 local_b4;
  VkPipelineColorBlendStateCreateInfo local_b0;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  local_1c0 = (this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
              m_internal;
  local_1f0 = (this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
              m_internal;
  local_2e8.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  viewport.width = (float)(this->m_renderSize).m_data[0];
  scissor.offset.x = (int)(scissorAreaFloat->m_data[0] * viewport.width);
  local_2f0.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  viewport.height = (float)(this->m_renderSize).m_data[1];
  scissor.extent.width = (deUint32)(scissorAreaFloat->m_data[2] * viewport.width);
  vertexInputStateInfo.pVertexBindingDescriptions = &vertexInputBindingDescription;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputStateInfo.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  local_338 = &vertexInputStateInfo;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 1;
  vertexInputStateInfo.vertexAttributeDescriptionCount = 2;
  local_330 = &pipelineInputAssemblyStateInfo;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo._16_8_ = (ulong)this->m_topology << 0x20;
  pipelineViewportStateInfo.pViewports = &viewport;
  viewport.x = 0.0;
  viewport.y = 0.0;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 1.0;
  scissor.offset.y = (int)(scissorAreaFloat->m_data[1] * viewport.height);
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.extent.height = (int)(scissorAreaFloat->m_data[3] * viewport.height);
  pVStack_320 = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.scissorCount = 1;
  local_318 = &pipelineRasterizationStateInfo;
  pipelineRasterizationStateInfo.pNext = (void *)0x0;
  pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
  pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.lineWidth = 1.0;
  pipelineRasterizationStateInfo._60_4_ = 0;
  local_310 = &pipelineMultisampleStateInfo;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_308 = (VkPipelineDepthStencilStateCreateInfo *)local_118;
  local_118._0_4_ = 0x19;
  local_118._8_8_ = 0;
  local_118._16_8_ = 0;
  local_118._24_8_ = 0x100000000;
  local_118._32_8_ = 0;
  local_118._40_8_ = 0;
  local_118._48_8_ = 0x700000000;
  local_e0 = (VkClearValue *)0x0;
  uStack_d8 = 0;
  local_d0 = 0;
  local_c8 = 7;
  local_c4 = 0;
  uStack_bc = 0;
  local_b4 = 0x3f800000;
  local_300 = &local_b0;
  local_b0.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_b0.pNext = (void *)0x0;
  local_b0.flags = 0;
  local_b0.logicOpEnable = 0;
  local_b0.logicOp = VK_LOGIC_OP_COPY;
  local_b0.attachmentCount = 1;
  local_b0.pAttachments = &pipelineColorBlendAttachmentState;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  clearValue.depthStencil.depth = 2.52234e-44;
  clearValue._8_8_ = 0;
  local_1f8 = 0x100000000;
  local_1e8 = "main";
  local_1e0 = 0;
  local_1d8 = 0x12;
  local_1d0 = 0;
  local_1c8 = 0x1000000000;
  local_1b8 = "main";
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x1c);
  pvStack_350 = (void *)0x0;
  local_348._0_4_ = 0;
  local_348._4_4_ = 2;
  local_328 = 0;
  dStack_324 = 0;
  local_b0.blendConstants[0] = 0.0;
  local_b0.blendConstants[1] = 0.0;
  local_b0.blendConstants[2] = 0.0;
  local_b0.blendConstants[3] = 0.0;
  local_2f8 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_1b0 = 0;
  local_2e0 = 0;
  local_2d8.m_internal = 0;
  local_2d0 = 0;
  pVStack_340 = &clearValue;
  ::vk::createGraphicsPipeline
            (&local_288,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&vertexBufferOffset,(VkAllocationCallbacks *)0x0);
  DStack_370.m_deviceIface =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  DStack_370.m_device =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_370.m_allocator =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  beginCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  clearValue.depthStencil.depth = (this->m_clearColor).m_data[0];
  clearValue.depthStencil.stencil = (deUint32)(this->m_clearColor).m_data[1];
  clearValue._8_8_ = *(undefined8 *)((this->m_clearColor).m_data + 2);
  local_118._40_8_ = *(undefined8 *)(this->m_renderSize).m_data;
  local_118._0_4_ = 0x2b;
  local_118._8_8_ = 0;
  local_118._16_8_ =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_118._24_8_ =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  local_118._32_8_ = 0;
  local_118._48_4_ = 1;
  local_e0 = &clearValue;
  (*vk->_vptr_DeviceInterface[0x74])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,local_118,0
            );
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)((long)(this->m_vertices).
                           super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_vertices).
                          super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2d);
  pvStack_350 = (void *)0x0;
  local_348._0_4_ = 0x100;
  local_348._4_4_ = 0x800;
  pVStack_340 = (VkClearValue *)0x600000002;
  local_338 = (VkPipelineVertexInputStateCreateInfo *)0xffffffffffffffff;
  dVar1 = (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  local_330._0_4_ = (undefined4)dVar1;
  local_330._4_4_ = (undefined4)(dVar1 >> 0x20);
  local_328 = (this->m_colorSubresourceRange).aspectMask;
  dStack_324 = (this->m_colorSubresourceRange).baseMipLevel;
  pVStack_320 = *(VkPipelineViewportStateCreateInfo **)&(this->m_colorSubresourceRange).levelCount;
  local_318 = (VkPipelineRasterizationStateCreateInfo *)
              CONCAT44(local_318._4_4_,(this->m_colorSubresourceRange).layerCount);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x400,
             0x1000,0,0,0,0,0,1,&vertexBufferOffset);
  vertexBufferOffset = 0;
  pvStack_350 = (void *)0x0;
  local_348._0_4_ = 1;
  local_348._4_4_ = 0;
  pVStack_340 = (VkClearValue *)0x100000000;
  local_338 = (VkPipelineVertexInputStateCreateInfo *)0x0;
  local_330._0_4_ = 0;
  uVar2 = *(undefined8 *)(this->m_renderSize).m_data;
  local_330._4_4_ = (undefined4)uVar2;
  local_328 = (VkImageAspectFlags)((ulong)uVar2 >> 0x20);
  dStack_324 = 1;
  (*vk->_vptr_DeviceInterface[99])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,colorBuffer.m_internal,1,&vertexBufferOffset);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2c);
  pvStack_350 = (void *)0x0;
  local_348._0_4_ = 0x1000;
  local_348._4_4_ = 0x2000;
  pVStack_340 = (VkClearValue *)0xffffffffffffffff;
  local_330._0_4_ = 0;
  local_330._4_4_ = 0;
  local_328 = 0xffffffff;
  dStack_324 = 0xffffffff;
  local_338 = (VkPipelineVertexInputStateCreateInfo *)colorBuffer.m_internal;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,
             0x4000,0,0,0,1,&vertexBufferOffset,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorTests.cpp"
                    ,0x29a);
  submitCommandsAndWait
            (vk,device,queue,
             (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  if (local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_370,
               (VkPipeline)
               local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void draw (Context& context, const Vec4& scissorAreaFloat, const VkBuffer colorBuffer) const
	{
		const DeviceInterface&		vk			= context.getDeviceInterface();
		const VkDevice				device		= context.getDevice();
		const VkQueue				queue		= context.getUniversalQueue();

		// New pipeline, because we're modifying scissor (we don't use dynamic state).
		const Unique<VkPipeline>	pipeline	(makeGraphicsPipeline(vk, device, *m_pipelineLayout, *m_renderPass, *m_vertexModule, *m_fragmentModule,
												 m_renderSize, getAreaRect(scissorAreaFloat, m_renderSize.x(), m_renderSize.y()), m_topology));

		beginCommandBuffer(vk, *m_cmdBuffer);

		const VkClearValue			clearValue	= makeClearValueColor(m_clearColor);
		const VkRect2D				renderArea	=
		{
			makeOffset2D(0, 0),
			makeExtent2D(m_renderSize.x(), m_renderSize.y()),
		};
		const VkRenderPassBeginInfo renderPassBeginInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*m_renderPass,									// VkRenderPass            renderPass;
			*m_framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			1u,												// uint32_t                clearValueCount;
			&clearValue,									// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Prepare color image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*m_colorImage,												// VkImage					image;
					m_colorSubresourceRange,									// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Color image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),			// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(m_renderSize.x(), m_renderSize.y(), 1u),						// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					colorBuffer,									// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					VK_WHOLE_SIZE,									// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);
	}